

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::TestGroup::~TestGroup(TestGroup *this)

{
  vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *unaff_retaddr
  ;
  RunContext *in_stack_00000070;
  
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector(unaff_retaddr);
  clara::std::
  set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~set((set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
          *)0x135b90);
  RunContext::~RunContext(in_stack_00000070);
  clara::std::shared_ptr<Catch::Config>::~shared_ptr((shared_ptr<Catch::Config> *)0x135ba8);
  return;
}

Assistant:

explicit TestGroup(std::shared_ptr<Config> const& config)
            : m_config{config}
            , m_context{config, makeReporter(config)}
            {
                auto const& allTestCases = getAllTestCasesSorted(*m_config);
                m_matches = m_config->testSpec().matchesByFilter(allTestCases, *m_config);
                auto const& invalidArgs = m_config->testSpec().getInvalidArgs();

                if (m_matches.empty() && invalidArgs.empty()) {
                    for (auto const& test : allTestCases)
                        if (!test.isHidden())
                            m_tests.emplace(&test);
                } else {
                    for (auto const& match : m_matches)
                        m_tests.insert(match.tests.begin(), match.tests.end());
                }
            }